

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
::find_soo<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                *this,key_arg<int> *key)

{
  size_t sVar1;
  slot_type *psVar2;
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  undefined1 *puVar4;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  iterator iVar5;
  
  sVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar1 != 1) {
    if (sVar1 == 0) {
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, float>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, float>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, float>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, float>>]"
                   );
    }
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, float>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, float>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<int, float>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, float>>, K = int]"
                 );
  }
  AssertNotDebugCapacity(this);
  if (1 < (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    psVar2 = soo_slot(this);
    if ((psVar2->value).first == *key) {
      aVar3.slot_ = soo_slot(this);
      puVar4 = kSooControl;
      goto LAB_001af9b0;
    }
  }
  AssertNotDebugCapacity(this);
  puVar4 = (ctrl_t *)0x0;
  aVar3 = extraout_RDX;
LAB_001af9b0:
  iVar5.field_1.slot_ = aVar3.slot_;
  iVar5.ctrl_ = puVar4;
  return iVar5;
}

Assistant:

size_t capacity() const { return capacity_; }